

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O1

Literal * __thiscall wasm::Literal::wrapToI32(Literal *__return_storage_ptr__,Literal *this)

{
  if ((this->type).id == 3) {
    (__return_storage_ptr__->field_0).i32 = (this->field_0).i32;
    (__return_storage_ptr__->type).id = 2;
    return __return_storage_ptr__;
  }
  __assert_fail("type == Type::i64",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                ,0x328,"Literal wasm::Literal::wrapToI32() const");
}

Assistant:

bool operator==(const BasicType& other) const { return id == other; }